

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  bool bVar4;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCaseInfo info;
  allocator local_19a;
  allocator local_199;
  ITestCase *local_198;
  SourceLineInfo *local_190;
  string *local_188;
  string local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  key_type local_130;
  undefined1 local_110 [224];
  
  local_198 = _testCase;
  local_190 = _lineInfo;
  local_188 = _className;
  std::__cxx11::string::string((string *)&local_180,(string *)_descOrTags);
  std::__cxx11::string::string((string *)local_110,"./",(allocator *)&local_160);
  bVar2 = startsWith(_name,(string *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  p_Var1 = &local_160._M_impl.super__Rb_tree_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._0_8_ = &PTR__TagExtracter_00161858;
  local_110._16_8_ = local_110 + 0x20;
  local_110._24_8_ = 0;
  local_110[0x20] = '\0';
  local_160._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_110._8_8_ = (allocator *)&local_160;
  TagExtracter::parse((TagExtracter *)local_110,&local_180);
  TagExtracter::~TagExtracter((TagExtracter *)local_110);
  std::__cxx11::string::string((string *)local_110,"hide",&local_199);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_160,(key_type *)local_110);
  bVar4 = true;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    std::__cxx11::string::string((string *)&local_130,".",&local_19a);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_160,&local_130);
    bVar4 = (_Rb_tree_header *)iVar3._M_node != p_Var1;
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)local_110);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_110,_name,local_188,&local_180,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_160,(bool)(bVar2 | bVar4),local_190);
  TestCase::TestCase(__return_storage_ptr__,local_198,(TestCaseInfo *)local_110);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_110);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        std::string desc = _descOrTags;
        bool isHidden( startsWith( _name, "./" ) );
        std::set<std::string> tags;
        TagExtracter( tags ).parse( desc );
        if( tags.find( "hide" ) != tags.end() || tags.find( "." ) != tags.end() )
            isHidden = true;

        TestCaseInfo info( _name, _className, desc, tags, isHidden, _lineInfo );
        return TestCase( _testCase, info );
    }